

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O0

void Hacl_GenericField32_exp_consttime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *aM,uint32_t bBits,
               uint32_t *b,uint32_t *resM)

{
  long lVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint32_t uVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  uint32_t auStack_660 [4];
  uint32_t *local_650;
  uint32_t *local_648;
  uint32_t *local_640;
  uint32_t *local_638;
  uint32_t *local_630;
  uint32_t *local_628;
  uint32_t *local_620;
  uint32_t *ctx_n_9;
  uint32_t *puStack_610;
  uint32_t x_29;
  uint32_t *os_29;
  uint32_t *puStack_600;
  uint32_t i_33;
  uint32_t *res_j_29;
  uint32_t c_29;
  uint32_t x_28;
  uint32_t *os_28;
  uint32_t *puStack_5e0;
  uint32_t i_32;
  uint32_t *res_j_28;
  uint32_t c_28;
  uint32_t x_27;
  uint32_t *os_27;
  uint32_t *puStack_5c0;
  uint32_t i_31;
  uint32_t *res_j_27;
  uint32_t c_27;
  uint32_t x_26;
  uint32_t *os_26;
  uint32_t *puStack_5a0;
  uint32_t i_30;
  uint32_t *res_j_26;
  uint32_t c_26;
  uint32_t x_25;
  uint32_t *os_25;
  uint32_t *puStack_580;
  uint32_t i_29;
  uint32_t *res_j_25;
  uint32_t c_25;
  uint32_t x_24;
  uint32_t *os_24;
  uint32_t *puStack_560;
  uint32_t i_28;
  uint32_t *res_j_24;
  uint32_t c_24;
  uint32_t x_23;
  uint32_t *os_23;
  uint32_t *puStack_540;
  uint32_t i_27;
  uint32_t *res_j_23;
  uint32_t c_23;
  uint32_t x_22;
  uint32_t *os_22;
  uint32_t *puStack_520;
  uint32_t i_26;
  uint32_t *res_j_22;
  uint32_t c_22;
  uint32_t x_21;
  uint32_t *os_21;
  uint32_t *puStack_500;
  uint32_t i_25;
  uint32_t *res_j_21;
  uint32_t c_21;
  uint32_t x_20;
  uint32_t *os_20;
  uint32_t *puStack_4e0;
  uint32_t i_24;
  uint32_t *res_j_20;
  uint32_t c_20;
  uint32_t x_19;
  uint32_t *os_19;
  uint32_t *puStack_4c0;
  uint32_t i_23;
  uint32_t *res_j_19;
  uint32_t c_19;
  uint32_t x_18;
  uint32_t *os_18;
  uint32_t *puStack_4a0;
  uint32_t i_22;
  uint32_t *res_j_18;
  uint32_t c_18;
  uint32_t x_17;
  uint32_t *os_17;
  uint32_t *puStack_480;
  uint32_t i_21;
  uint32_t *res_j_17;
  uint32_t c_17;
  uint32_t x_16;
  uint32_t *os_16;
  uint32_t *puStack_460;
  uint32_t i_20;
  uint32_t *res_j_16;
  uint32_t c_16;
  uint32_t x_15;
  uint32_t *os_15;
  uint32_t *puStack_440;
  uint32_t i_19;
  uint32_t *res_j_15;
  uint32_t c_15;
  uint32_t i1_2;
  uint32_t bits_l;
  uint32_t k2;
  uint32_t *ctx_n_13;
  uint32_t *ctx_n_12;
  uint32_t *ctx_n_11;
  uint32_t *ctx_n_10;
  uint32_t i_18;
  uint32_t i0_2;
  unsigned_long __vla_expr5;
  uint32_t *ctx_r2_1;
  uint32_t *ctx_n_8;
  uint32_t *puStack_3e0;
  uint32_t x_14;
  uint32_t *os_14;
  uint32_t *puStack_3d0;
  uint32_t i_17;
  uint32_t *res_j_14;
  uint32_t c_14;
  uint32_t x_13;
  uint32_t *os_13;
  uint32_t *puStack_3b0;
  uint32_t i_16;
  uint32_t *res_j_13;
  uint32_t c_13;
  uint32_t x_12;
  uint32_t *os_12;
  uint32_t *puStack_390;
  uint32_t i_15;
  uint32_t *res_j_12;
  uint32_t c_12;
  uint32_t x_11;
  uint32_t *os_11;
  uint32_t *puStack_370;
  uint32_t i_14;
  uint32_t *res_j_11;
  uint32_t c_11;
  uint32_t x_10;
  uint32_t *os_10;
  uint32_t *puStack_350;
  uint32_t i_13;
  uint32_t *res_j_10;
  uint32_t c_10;
  uint32_t x_9;
  uint32_t *os_9;
  uint32_t *puStack_330;
  uint32_t i_12;
  uint32_t *res_j_9;
  uint32_t c_9;
  uint32_t x_8;
  uint32_t *os_8;
  uint32_t *puStack_310;
  uint32_t i_11;
  uint32_t *res_j_8;
  uint32_t c_8;
  uint32_t x_7;
  uint32_t *os_7;
  uint32_t *puStack_2f0;
  uint32_t i_10;
  uint32_t *res_j_7;
  uint32_t c_7;
  uint32_t x_6;
  uint32_t *os_6;
  uint32_t *puStack_2d0;
  uint32_t i_9;
  uint32_t *res_j_6;
  uint32_t c_6;
  uint32_t x_5;
  uint32_t *os_5;
  uint32_t *puStack_2b0;
  uint32_t i_8;
  uint32_t *res_j_5;
  uint32_t c_5;
  uint32_t x_4;
  uint32_t *os_4;
  uint32_t *puStack_290;
  uint32_t i_7;
  uint32_t *res_j_4;
  uint32_t c_4;
  uint32_t x_3;
  uint32_t *os_3;
  uint32_t *puStack_270;
  uint32_t i_6;
  uint32_t *res_j_3;
  uint32_t c_3;
  uint32_t x_2;
  uint32_t *os_2;
  uint32_t *puStack_250;
  uint32_t i_5;
  uint32_t *res_j_2;
  uint32_t c_2;
  uint32_t x_1;
  uint32_t *os_1;
  uint32_t *puStack_230;
  uint32_t i_4;
  uint32_t *res_j_1;
  uint32_t c_1;
  uint32_t x;
  uint32_t *os;
  uint32_t *puStack_210;
  uint32_t i_3;
  uint32_t *res_j;
  uint32_t c;
  uint32_t i1_1;
  uint32_t bits_c;
  uint32_t i0_1;
  uint32_t *ctx_n_7;
  uint32_t *t2_6;
  uint32_t *ctx_n1_7;
  uint32_t *t11_6;
  uint32_t *ctx_n_6;
  uint32_t *t2_5;
  uint32_t *ctx_n1_6;
  uint32_t *t11_5;
  uint32_t *ctx_n_5;
  uint32_t *t2_4;
  uint32_t *ctx_n1_5;
  uint32_t *t11_4;
  uint32_t *ctx_n_4;
  uint32_t *t2_3;
  uint32_t *ctx_n1_4;
  uint32_t *t11_3;
  uint32_t *ctx_n_3;
  uint32_t *t2_2;
  uint32_t *ctx_n1_3;
  uint32_t *t11_2;
  uint32_t *ctx_n_2;
  uint32_t *t2_1;
  uint32_t *ctx_n1_2;
  uint32_t *t11_1;
  uint32_t *ctx_n_1;
  uint32_t *t2;
  uint32_t *ctx_n1_1;
  uint32_t *t11;
  uint32_t *puStack_110;
  uint32_t i_2;
  uint32_t *ctx_r20;
  uint32_t *ctx_n0_1;
  uint32_t *t1;
  uint32_t *t0;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  uint32_t local_d0;
  uint32_t bLen;
  uint32_t dummy_1;
  uint32_t i_1;
  uint32_t sw0;
  uint32_t *ctx_n1;
  uint32_t *ctx_n0;
  uint32_t dummy;
  uint32_t i;
  uint32_t sw1;
  uint32_t bit;
  uint32_t tmp;
  uint32_t j;
  uint32_t i1;
  uint32_t i0;
  uint32_t *ctx_r2;
  uint32_t *ctx_n;
  ulong uStack_78;
  uint32_t sw;
  unsigned_long __vla_expr1;
  ulong local_68;
  unsigned_long __vla_expr0;
  ulong local_58;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1;
  uint32_t len1;
  uint32_t *resM_local;
  uint32_t *b_local;
  uint32_t bBits_local;
  uint32_t *aM_local;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k_local;
  
  auStack_660[0] = 0x2016b7;
  auStack_660[1] = 0;
  k1.r2._4_4_ = Hacl_GenericField32_field_get_len(k);
  local_58 = *(ulong *)k;
  k1._0_8_ = k->n;
  k1.n = *(uint32_t **)&k->mu;
  k1._16_8_ = k->r2;
  if (0x3fffffffffffffff < (local_58 & 0xffffffff)) {
    auStack_660[0] = 0x201709;
    auStack_660[1] = 0;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
           ,0x11a);
    auStack_660[0] = 0x201713;
    auStack_660[1] = 0;
    exit(0xfd);
  }
  local_68 = local_58 & 0xffffffff;
  lVar1 = -(local_68 * 4 + 0xf & 0xfffffffffffffff0);
  puVar4 = (uint32_t *)((long)auStack_660 + lVar1 + 8);
  uVar7 = local_58 & 0xffffffff;
  local_628 = puVar4;
  __vla_expr0 = (unsigned_long)(auStack_660 + 2);
  *(undefined8 *)((long)auStack_660 + lVar1) = 0x20174f;
  memset(puVar4,0,uVar7 << 2);
  puVar11 = local_628;
  uVar7 = local_58 & 0xffffffff;
  *(undefined8 *)((long)auStack_660 + lVar1) = 0x201768;
  memcpy(puVar11,aM,uVar7 << 2);
  if (bBits < 200) {
    if (0x3fffffffffffffff < (ulong)(k1.r2._4_4_ * 2)) {
      *(undefined8 *)((long)auStack_660 + lVar1) = 0x2017a8;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x120);
      *(undefined8 *)((long)auStack_660 + lVar1) = 0x2017b2;
      exit(0xfd);
    }
    uStack_78 = (ulong)(k1.r2._4_4_ * 2);
    puVar10 = (uint32_t *)((long)puVar4 - (uStack_78 * 4 + 0xf & 0xfffffffffffffff0));
    uVar6 = k1.r2._4_4_ * 2;
    local_630 = puVar10;
    __vla_expr1 = (unsigned_long)puVar4;
    puVar10[-2] = 0x2017f7;
    puVar10[-1] = 0;
    memset(puVar10,0,(ulong)uVar6 << 2);
    uVar3 = k1._0_8_;
    puVar11 = local_630;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201810;
    puVar10[-1] = 0;
    memcpy(puVar11,(void *)uVar3,uVar7 << 2);
    uVar3 = k1._16_8_;
    puVar11 = local_630 + k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201833;
    puVar10[-1] = 0;
    memcpy(puVar11,(void *)uVar3,uVar7 << 2);
    uVar6 = k1.r2._4_4_;
    puVar11 = local_630;
    ctx_n._4_4_ = 0;
    ctx_r2 = local_630;
    puVar4 = local_630 + k1.r2._4_4_;
    uVar2 = (uint32_t)k1.n;
    _i1 = puVar4;
    puVar10[-2] = 0x201870;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar6,puVar11,uVar2,puVar4,resM);
    for (j = 0; uVar6 = k1.r2._4_4_, puVar4 = local_628, puVar11 = local_630, j < bBits; j = j + 1)
    {
      tmp = (bBits - j) - 1 >> 5;
      bit = (bBits - j) - 1 & 0x1f;
      sw1 = b[tmp];
      i = sw1 >> (sbyte)bit & 1;
      dummy = i ^ ctx_n._4_4_;
      for (ctx_n0._4_4_ = 0; ctx_n0._4_4_ < k1.r2._4_4_; ctx_n0._4_4_ = ctx_n0._4_4_ + 1) {
        ctx_n0._0_4_ = -dummy & (resM[ctx_n0._4_4_] ^ local_628[ctx_n0._4_4_]);
        resM[ctx_n0._4_4_] = resM[ctx_n0._4_4_] ^ (uint)ctx_n0;
        local_628[ctx_n0._4_4_] = local_628[ctx_n0._4_4_] ^ (uint)ctx_n0;
      }
      ctx_n1 = local_630;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x2019a8;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar6,puVar11,uVar2,puVar4,resM,puVar4);
      uVar9 = k1.r2._4_4_;
      puVar11 = local_630;
      _i_1 = local_630;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x2019d0;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar11,uVar2,resM,resM);
      ctx_n._4_4_ = i;
    }
    for (bLen = 0; bLen < k1.r2._4_4_; bLen = bLen + 1) {
      uVar6 = -ctx_n._4_4_ & (resM[bLen] ^ local_628[bLen]);
      resM[bLen] = resM[bLen] ^ uVar6;
      local_628[bLen] = local_628[bLen] ^ uVar6;
    }
  }
  else {
    if (bBits == 0) {
      local_d0 = 1;
    }
    else {
      local_d0 = (bBits - 1 >> 5) + 1;
    }
    if (0x3fffffffffffffff < (ulong)(k1.r2._4_4_ * 2)) {
      *(undefined8 *)((long)auStack_660 + lVar1) = 0x201ae7;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x14f);
      *(undefined8 *)((long)auStack_660 + lVar1) = 0x201af1;
      exit(0xfd);
    }
    __vla_expr3 = (unsigned_long)(k1.r2._4_4_ * 2);
    puVar10 = (uint32_t *)((long)puVar4 - (__vla_expr3 * 4 + 0xf & 0xfffffffffffffff0));
    uVar6 = k1.r2._4_4_ * 2;
    local_638 = puVar10;
    __vla_expr2 = (unsigned_long)puVar4;
    puVar10[-2] = 0x201b3c;
    puVar10[-1] = 0;
    memset(puVar10,0,(ulong)uVar6 << 2);
    uVar3 = k1._0_8_;
    puVar11 = local_638;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201b55;
    puVar10[-1] = 0;
    memcpy(puVar11,(void *)uVar3,uVar7 << 2);
    uVar3 = k1._16_8_;
    puVar11 = local_638 + k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201b78;
    puVar10[-1] = 0;
    memcpy(puVar11,(void *)uVar3,uVar7 << 2);
    if (0x3fffffffffffffff < (ulong)(k1.r2._4_4_ << 4)) {
      puVar10[-2] = 0x201ba9;
      puVar10[-1] = 0;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x154);
      puVar10[-2] = 0x201bb3;
      puVar10[-1] = 0;
      exit(0xfd);
    }
    __vla_expr4 = (unsigned_long)(k1.r2._4_4_ << 4);
    puVar10 = puVar10 + -__vla_expr4;
    uVar6 = k1.r2._4_4_ << 4;
    local_640 = puVar10;
    puVar10[-2] = 0x201bf0;
    puVar10[-1] = 0;
    memset(puVar10,0,(ulong)uVar6 << 2);
    if (0x3fffffffffffffff < (ulong)k1.r2._4_4_) {
      puVar10[-2] = 0x201c1c;
      puVar10[-1] = 0;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x157);
      puVar10[-2] = 0x201c26;
      puVar10[-1] = 0;
      exit(0xfd);
    }
    t0 = (uint32_t *)(ulong)k1.r2._4_4_;
    puVar10 = (uint32_t *)((long)puVar10 - ((long)t0 * 4 + 0xfU & 0xfffffffffffffff0));
    uVar7 = (ulong)k1.r2._4_4_;
    local_648 = puVar10;
    puVar10[-2] = 0x201c60;
    puVar10[-1] = 0;
    memset(puVar10,0,uVar7 << 2);
    uVar6 = k1.r2._4_4_;
    puVar4 = local_638;
    puVar11 = local_640;
    t1 = local_640;
    ctx_n0_1 = local_640 + k1.r2._4_4_;
    ctx_r20 = local_638;
    puVar5 = local_638 + k1.r2._4_4_;
    uVar2 = (uint32_t)k1.n;
    puStack_110 = puVar5;
    puVar10[-2] = 0x201cbe;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar6,puVar4,uVar2,puVar5,puVar11);
    puVar4 = ctx_n0_1;
    puVar11 = local_628;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201cda;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar4 = local_638;
    puVar11 = local_648;
    t11._4_4_ = 0;
    puVar5 = local_640 + k1.r2._4_4_;
    t2 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_1 = puVar5;
    puVar10[-2] = 0x201d36;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar4,uVar2,puVar5,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201d6a;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar5 = local_628;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar8 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_1 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n_1 = puVar8;
    puVar10[-2] = 0x201dc5;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar9,puVar4,uVar2,puVar5,puVar8,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201df9;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar5 = local_640 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_1 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_2 = puVar5;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x201e5a;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar4,uVar2,puVar5,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201e8e;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar5 = local_628;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar8 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_2 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n_2 = puVar8;
    puVar10[-2] = 0x201ee9;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar9,puVar4,uVar2,puVar5,puVar8,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201f1d;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar5 = local_640 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_2 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_3 = puVar5;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x201f7e;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar4,uVar2,puVar5,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x201fb2;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar5 = local_628;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar8 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_3 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n_3 = puVar8;
    puVar10[-2] = 0x20200d;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar9,puVar4,uVar2,puVar5,puVar8,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x202041;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar5 = local_640 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_3 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_4 = puVar5;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x2020a2;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar4,uVar2,puVar5,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2020d6;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar5 = local_628;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar8 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_4 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n_4 = puVar8;
    puVar10[-2] = 0x202131;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar9,puVar4,uVar2,puVar5,puVar8,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x202165;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar5 = local_640 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_4 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_5 = puVar5;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x2021c6;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar4,uVar2,puVar5,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2021fa;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar5 = local_628;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar8 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_5 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n_5 = puVar8;
    puVar10[-2] = 0x202255;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar9,puVar4,uVar2,puVar5,puVar8,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x202289;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar5 = local_640 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_5 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_6 = puVar5;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x2022ea;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar4,uVar2,puVar5,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x20231e;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar5 = local_628;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar8 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_6 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n_6 = puVar8;
    puVar10[-2] = 0x202379;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar9,puVar4,uVar2,puVar5,puVar8,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2023ad;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar5 = local_640 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_6 = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n1_7 = puVar5;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-2] = 0x20240e;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar4,uVar2,puVar5,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x202442;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar9 = k1.r2._4_4_;
    puVar5 = local_628;
    puVar4 = local_638;
    puVar11 = local_648;
    puVar8 = local_640 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    _bits_c = local_638;
    uVar2 = (uint32_t)k1.n;
    ctx_n_7 = puVar8;
    puVar10[-2] = 0x20249d;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar9,puVar4,uVar2,puVar5,puVar8,puVar11);
    puVar11 = local_648;
    puVar4 = local_640 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar10[-2] = 0x2024d1;
    puVar10[-1] = 0;
    memcpy(puVar4,puVar11,uVar7 << 2);
    uVar6 = k1.r2._4_4_;
    uVar2 = local_d0;
    puVar11 = local_638;
    t11._4_4_ = t11._4_4_ + 1;
    if ((bBits & 3) == 0) {
      ctx_r2_1 = local_638;
      puVar4 = local_638 + k1.r2._4_4_;
      uVar2 = (uint32_t)k1.n;
      __vla_expr5 = (unsigned_long)puVar4;
      puVar10[-2] = 0x203166;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar6,puVar11,uVar2,puVar4,resM);
    }
    else {
      i1_1 = bBits & 0xfffffffc;
      puVar10[-2] = 0x20251a;
      puVar10[-1] = 0;
      c = Hacl_Bignum_Lib_bn_get_bits_u32(uVar2,b,bBits & 0xfffffffc,4);
      puVar11 = local_640;
      uVar7 = (ulong)k1.r2._4_4_;
      puVar10[-2] = 0x202546;
      puVar10[-1] = 0;
      memcpy(resM,puVar11,uVar7 << 2);
      uVar2 = c;
      res_j._4_4_ = 0;
      puVar10[-2] = 0x202564;
      puVar10[-1] = 0;
      res_j._0_4_ = FStar_UInt32_eq_mask(uVar2,1);
      uVar2 = c;
      puStack_210 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os._4_4_ = 0; os._4_4_ < k1.r2._4_4_; os._4_4_ = os._4_4_ + 1) {
        res_j_1._4_4_ =
             (uint32_t)res_j & puStack_210[os._4_4_] |
             ((uint32_t)res_j ^ 0xffffffff) & resM[os._4_4_];
        resM[os._4_4_] = res_j_1._4_4_;
        _c_1 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x20262e;
      puVar10[-1] = 0;
      res_j_1._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_230 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_1._4_4_ = 0; os_1._4_4_ < k1.r2._4_4_; os_1._4_4_ = os_1._4_4_ + 1) {
        res_j_2._4_4_ =
             (uint32_t)res_j_1 & puStack_230[os_1._4_4_] |
             ((uint32_t)res_j_1 ^ 0xffffffff) & resM[os_1._4_4_];
        resM[os_1._4_4_] = res_j_2._4_4_;
        _c_2 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x2026f8;
      puVar10[-1] = 0;
      res_j_2._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_250 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_2._4_4_ = 0; os_2._4_4_ < k1.r2._4_4_; os_2._4_4_ = os_2._4_4_ + 1) {
        res_j_3._4_4_ =
             (uint32_t)res_j_2 & puStack_250[os_2._4_4_] |
             ((uint32_t)res_j_2 ^ 0xffffffff) & resM[os_2._4_4_];
        resM[os_2._4_4_] = res_j_3._4_4_;
        _c_3 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x2027c2;
      puVar10[-1] = 0;
      res_j_3._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_270 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_3._4_4_ = 0; os_3._4_4_ < k1.r2._4_4_; os_3._4_4_ = os_3._4_4_ + 1) {
        res_j_4._4_4_ =
             (uint32_t)res_j_3 & puStack_270[os_3._4_4_] |
             ((uint32_t)res_j_3 ^ 0xffffffff) & resM[os_3._4_4_];
        resM[os_3._4_4_] = res_j_4._4_4_;
        _c_4 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x20288c;
      puVar10[-1] = 0;
      res_j_4._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_290 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_4._4_4_ = 0; os_4._4_4_ < k1.r2._4_4_; os_4._4_4_ = os_4._4_4_ + 1) {
        res_j_5._4_4_ =
             (uint32_t)res_j_4 & puStack_290[os_4._4_4_] |
             ((uint32_t)res_j_4 ^ 0xffffffff) & resM[os_4._4_4_];
        resM[os_4._4_4_] = res_j_5._4_4_;
        _c_5 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202956;
      puVar10[-1] = 0;
      res_j_5._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_2b0 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_5._4_4_ = 0; os_5._4_4_ < k1.r2._4_4_; os_5._4_4_ = os_5._4_4_ + 1) {
        res_j_6._4_4_ =
             (uint32_t)res_j_5 & puStack_2b0[os_5._4_4_] |
             ((uint32_t)res_j_5 ^ 0xffffffff) & resM[os_5._4_4_];
        resM[os_5._4_4_] = res_j_6._4_4_;
        _c_6 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202a20;
      puVar10[-1] = 0;
      res_j_6._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_2d0 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_6._4_4_ = 0; os_6._4_4_ < k1.r2._4_4_; os_6._4_4_ = os_6._4_4_ + 1) {
        res_j_7._4_4_ =
             (uint32_t)res_j_6 & puStack_2d0[os_6._4_4_] |
             ((uint32_t)res_j_6 ^ 0xffffffff) & resM[os_6._4_4_];
        resM[os_6._4_4_] = res_j_7._4_4_;
        _c_7 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202aea;
      puVar10[-1] = 0;
      res_j_7._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_2f0 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_7._4_4_ = 0; os_7._4_4_ < k1.r2._4_4_; os_7._4_4_ = os_7._4_4_ + 1) {
        res_j_8._4_4_ =
             (uint32_t)res_j_7 & puStack_2f0[os_7._4_4_] |
             ((uint32_t)res_j_7 ^ 0xffffffff) & resM[os_7._4_4_];
        resM[os_7._4_4_] = res_j_8._4_4_;
        _c_8 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202bb4;
      puVar10[-1] = 0;
      res_j_8._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_310 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_8._4_4_ = 0; os_8._4_4_ < k1.r2._4_4_; os_8._4_4_ = os_8._4_4_ + 1) {
        res_j_9._4_4_ =
             (uint32_t)res_j_8 & puStack_310[os_8._4_4_] |
             ((uint32_t)res_j_8 ^ 0xffffffff) & resM[os_8._4_4_];
        resM[os_8._4_4_] = res_j_9._4_4_;
        _c_9 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202c7e;
      puVar10[-1] = 0;
      res_j_9._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_330 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_9._4_4_ = 0; os_9._4_4_ < k1.r2._4_4_; os_9._4_4_ = os_9._4_4_ + 1) {
        res_j_10._4_4_ =
             (uint32_t)res_j_9 & puStack_330[os_9._4_4_] |
             ((uint32_t)res_j_9 ^ 0xffffffff) & resM[os_9._4_4_];
        resM[os_9._4_4_] = res_j_10._4_4_;
        _c_10 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202d48;
      puVar10[-1] = 0;
      res_j_10._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_350 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_10._4_4_ = 0; os_10._4_4_ < k1.r2._4_4_; os_10._4_4_ = os_10._4_4_ + 1) {
        res_j_11._4_4_ =
             (uint32_t)res_j_10 & puStack_350[os_10._4_4_] |
             ((uint32_t)res_j_10 ^ 0xffffffff) & resM[os_10._4_4_];
        resM[os_10._4_4_] = res_j_11._4_4_;
        _c_11 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202e12;
      puVar10[-1] = 0;
      res_j_11._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_370 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_11._4_4_ = 0; os_11._4_4_ < k1.r2._4_4_; os_11._4_4_ = os_11._4_4_ + 1) {
        res_j_12._4_4_ =
             (uint32_t)res_j_11 & puStack_370[os_11._4_4_] |
             ((uint32_t)res_j_11 ^ 0xffffffff) & resM[os_11._4_4_];
        resM[os_11._4_4_] = res_j_12._4_4_;
        _c_12 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202edc;
      puVar10[-1] = 0;
      res_j_12._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_390 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_12._4_4_ = 0; os_12._4_4_ < k1.r2._4_4_; os_12._4_4_ = os_12._4_4_ + 1) {
        res_j_13._4_4_ =
             (uint32_t)res_j_12 & puStack_390[os_12._4_4_] |
             ((uint32_t)res_j_12 ^ 0xffffffff) & resM[os_12._4_4_];
        resM[os_12._4_4_] = res_j_13._4_4_;
        _c_13 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x202fa6;
      puVar10[-1] = 0;
      res_j_13._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c;
      puStack_3b0 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_13._4_4_ = 0; os_13._4_4_ < k1.r2._4_4_; os_13._4_4_ = os_13._4_4_ + 1) {
        res_j_14._4_4_ =
             (uint32_t)res_j_13 & puStack_3b0[os_13._4_4_] |
             ((uint32_t)res_j_13 ^ 0xffffffff) & resM[os_13._4_4_];
        resM[os_13._4_4_] = res_j_14._4_4_;
        _c_14 = resM;
      }
      uVar9 = res_j._4_4_ + 2;
      res_j._4_4_ = res_j._4_4_ + 1;
      puVar10[-2] = 0x203070;
      puVar10[-1] = 0;
      res_j_14._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      puStack_3d0 = local_640 + (res_j._4_4_ + 1) * k1.r2._4_4_;
      for (os_14._4_4_ = 0; os_14._4_4_ < k1.r2._4_4_; os_14._4_4_ = os_14._4_4_ + 1) {
        ctx_n_8._4_4_ =
             (uint32_t)res_j_14 & puStack_3d0[os_14._4_4_] |
             ((uint32_t)res_j_14 ^ 0xffffffff) & resM[os_14._4_4_];
        resM[os_14._4_4_] = ctx_n_8._4_4_;
        puStack_3e0 = resM;
      }
      res_j._4_4_ = res_j._4_4_ + 1;
    }
    if (0x3fffffffffffffff < (ulong)k1.r2._4_4_) {
      puVar10[-2] = 0x203194;
      puVar10[-1] = 0;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField32.c"
             ,0x184);
      puVar10[-2] = 0x20319e;
      puVar10[-1] = 0;
      exit(0xfd);
    }
    _i_18 = (ulong)k1.r2._4_4_;
    puVar10 = (uint32_t *)((long)puVar10 - (_i_18 * 4 + 0xf & 0xfffffffffffffff0));
    uVar7 = (ulong)k1.r2._4_4_;
    local_650 = puVar10;
    puVar10[-2] = 0x2031d8;
    puVar10[-1] = 0;
    memset(puVar10,0,uVar7 << 2);
    for (ctx_n_10._4_4_ = 0; uVar2 = k1.r2._4_4_, puVar11 = local_638, ctx_n_10._4_4_ < bBits >> 2;
        ctx_n_10._4_4_ = ctx_n_10._4_4_ + 1) {
      ctx_n_10._0_4_ = 0;
      ctx_n_11 = local_638;
      uVar9 = (uint32_t)k1.n;
      puVar10[-2] = 0x20322a;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar11,uVar9,resM,resM);
      uVar9 = k1.r2._4_4_;
      puVar11 = local_638;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      ctx_n_12 = local_638;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x203261;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar11,uVar2,resM,resM);
      uVar9 = k1.r2._4_4_;
      puVar11 = local_638;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      ctx_n_13 = local_638;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x203298;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar11,uVar2,resM,resM);
      uVar9 = k1.r2._4_4_;
      puVar11 = local_638;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      _bits_l = local_638;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x2032cf;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar9,puVar11,uVar2,resM,resM);
      uVar2 = local_d0;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      uVar9 = ((bBits - (bBits & 3)) + ctx_n_10._4_4_ * -4) - 4;
      i1_2 = uVar9;
      puVar10[-2] = 0x203319;
      puVar10[-1] = 0;
      c_15 = Hacl_Bignum_Lib_bn_get_bits_u32(uVar2,b,uVar9,4);
      puVar4 = local_640;
      puVar11 = local_650;
      uVar7 = (ulong)k1.r2._4_4_;
      puVar10[-2] = 0x203348;
      puVar10[-1] = 0;
      memcpy(puVar11,puVar4,uVar7 << 2);
      uVar2 = c_15;
      res_j_15._4_4_ = 0;
      puVar10[-2] = 0x203366;
      puVar10[-1] = 0;
      res_j_15._0_4_ = FStar_UInt32_eq_mask(uVar2,1);
      uVar2 = c_15;
      puStack_440 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_15._4_4_ = 0; os_15._4_4_ < k1.r2._4_4_; os_15._4_4_ = os_15._4_4_ + 1) {
        _c_16 = local_650;
        res_j_16._4_4_ =
             (uint32_t)res_j_15 & puStack_440[os_15._4_4_] |
             ((uint32_t)res_j_15 ^ 0xffffffff) & local_650[os_15._4_4_];
        local_650[os_15._4_4_] = res_j_16._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x20342f;
      puVar10[-1] = 0;
      res_j_16._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_460 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_16._4_4_ = 0; os_16._4_4_ < k1.r2._4_4_; os_16._4_4_ = os_16._4_4_ + 1) {
        _c_17 = local_650;
        res_j_17._4_4_ =
             (uint32_t)res_j_16 & puStack_460[os_16._4_4_] |
             ((uint32_t)res_j_16 ^ 0xffffffff) & local_650[os_16._4_4_];
        local_650[os_16._4_4_] = res_j_17._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x2034f8;
      puVar10[-1] = 0;
      res_j_17._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_480 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_17._4_4_ = 0; os_17._4_4_ < k1.r2._4_4_; os_17._4_4_ = os_17._4_4_ + 1) {
        _c_18 = local_650;
        res_j_18._4_4_ =
             (uint32_t)res_j_17 & puStack_480[os_17._4_4_] |
             ((uint32_t)res_j_17 ^ 0xffffffff) & local_650[os_17._4_4_];
        local_650[os_17._4_4_] = res_j_18._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x2035c1;
      puVar10[-1] = 0;
      res_j_18._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_4a0 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_18._4_4_ = 0; os_18._4_4_ < k1.r2._4_4_; os_18._4_4_ = os_18._4_4_ + 1) {
        _c_19 = local_650;
        res_j_19._4_4_ =
             (uint32_t)res_j_18 & puStack_4a0[os_18._4_4_] |
             ((uint32_t)res_j_18 ^ 0xffffffff) & local_650[os_18._4_4_];
        local_650[os_18._4_4_] = res_j_19._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x20368a;
      puVar10[-1] = 0;
      res_j_19._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_4c0 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_19._4_4_ = 0; os_19._4_4_ < k1.r2._4_4_; os_19._4_4_ = os_19._4_4_ + 1) {
        _c_20 = local_650;
        res_j_20._4_4_ =
             (uint32_t)res_j_19 & puStack_4c0[os_19._4_4_] |
             ((uint32_t)res_j_19 ^ 0xffffffff) & local_650[os_19._4_4_];
        local_650[os_19._4_4_] = res_j_20._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x203753;
      puVar10[-1] = 0;
      res_j_20._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_4e0 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_20._4_4_ = 0; os_20._4_4_ < k1.r2._4_4_; os_20._4_4_ = os_20._4_4_ + 1) {
        _c_21 = local_650;
        res_j_21._4_4_ =
             (uint32_t)res_j_20 & puStack_4e0[os_20._4_4_] |
             ((uint32_t)res_j_20 ^ 0xffffffff) & local_650[os_20._4_4_];
        local_650[os_20._4_4_] = res_j_21._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x20381c;
      puVar10[-1] = 0;
      res_j_21._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_500 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_21._4_4_ = 0; os_21._4_4_ < k1.r2._4_4_; os_21._4_4_ = os_21._4_4_ + 1) {
        _c_22 = local_650;
        res_j_22._4_4_ =
             (uint32_t)res_j_21 & puStack_500[os_21._4_4_] |
             ((uint32_t)res_j_21 ^ 0xffffffff) & local_650[os_21._4_4_];
        local_650[os_21._4_4_] = res_j_22._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x2038e5;
      puVar10[-1] = 0;
      res_j_22._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_520 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_22._4_4_ = 0; os_22._4_4_ < k1.r2._4_4_; os_22._4_4_ = os_22._4_4_ + 1) {
        _c_23 = local_650;
        res_j_23._4_4_ =
             (uint32_t)res_j_22 & puStack_520[os_22._4_4_] |
             ((uint32_t)res_j_22 ^ 0xffffffff) & local_650[os_22._4_4_];
        local_650[os_22._4_4_] = res_j_23._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x2039ae;
      puVar10[-1] = 0;
      res_j_23._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_540 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_23._4_4_ = 0; os_23._4_4_ < k1.r2._4_4_; os_23._4_4_ = os_23._4_4_ + 1) {
        _c_24 = local_650;
        res_j_24._4_4_ =
             (uint32_t)res_j_23 & puStack_540[os_23._4_4_] |
             ((uint32_t)res_j_23 ^ 0xffffffff) & local_650[os_23._4_4_];
        local_650[os_23._4_4_] = res_j_24._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x203a77;
      puVar10[-1] = 0;
      res_j_24._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_560 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_24._4_4_ = 0; os_24._4_4_ < k1.r2._4_4_; os_24._4_4_ = os_24._4_4_ + 1) {
        _c_25 = local_650;
        res_j_25._4_4_ =
             (uint32_t)res_j_24 & puStack_560[os_24._4_4_] |
             ((uint32_t)res_j_24 ^ 0xffffffff) & local_650[os_24._4_4_];
        local_650[os_24._4_4_] = res_j_25._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x203b40;
      puVar10[-1] = 0;
      res_j_25._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_580 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_25._4_4_ = 0; os_25._4_4_ < k1.r2._4_4_; os_25._4_4_ = os_25._4_4_ + 1) {
        _c_26 = local_650;
        res_j_26._4_4_ =
             (uint32_t)res_j_25 & puStack_580[os_25._4_4_] |
             ((uint32_t)res_j_25 ^ 0xffffffff) & local_650[os_25._4_4_];
        local_650[os_25._4_4_] = res_j_26._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x203c09;
      puVar10[-1] = 0;
      res_j_26._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_5a0 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_26._4_4_ = 0; os_26._4_4_ < k1.r2._4_4_; os_26._4_4_ = os_26._4_4_ + 1) {
        _c_27 = local_650;
        res_j_27._4_4_ =
             (uint32_t)res_j_26 & puStack_5a0[os_26._4_4_] |
             ((uint32_t)res_j_26 ^ 0xffffffff) & local_650[os_26._4_4_];
        local_650[os_26._4_4_] = res_j_27._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x203cd2;
      puVar10[-1] = 0;
      res_j_27._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_5c0 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_27._4_4_ = 0; os_27._4_4_ < k1.r2._4_4_; os_27._4_4_ = os_27._4_4_ + 1) {
        _c_28 = local_650;
        res_j_28._4_4_ =
             (uint32_t)res_j_27 & puStack_5c0[os_27._4_4_] |
             ((uint32_t)res_j_27 ^ 0xffffffff) & local_650[os_27._4_4_];
        local_650[os_27._4_4_] = res_j_28._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x203d9b;
      puVar10[-1] = 0;
      res_j_28._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar2 = c_15;
      puStack_5e0 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_28._4_4_ = 0; os_28._4_4_ < k1.r2._4_4_; os_28._4_4_ = os_28._4_4_ + 1) {
        _c_29 = local_650;
        res_j_29._4_4_ =
             (uint32_t)res_j_28 & puStack_5e0[os_28._4_4_] |
             ((uint32_t)res_j_28 ^ 0xffffffff) & local_650[os_28._4_4_];
        local_650[os_28._4_4_] = res_j_29._4_4_;
      }
      uVar9 = res_j_15._4_4_ + 2;
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      puVar10[-2] = 0x203e64;
      puVar10[-1] = 0;
      res_j_29._0_4_ = FStar_UInt32_eq_mask(uVar2,uVar9);
      uVar6 = k1.r2._4_4_;
      puVar4 = local_638;
      puVar11 = local_650;
      puStack_600 = local_640 + (res_j_15._4_4_ + 1) * k1.r2._4_4_;
      for (os_29._4_4_ = 0; os_29._4_4_ < k1.r2._4_4_; os_29._4_4_ = os_29._4_4_ + 1) {
        puStack_610 = local_650;
        ctx_n_9._4_4_ =
             (uint32_t)res_j_29 & puStack_600[os_29._4_4_] |
             ((uint32_t)res_j_29 ^ 0xffffffff) & local_650[os_29._4_4_];
        local_650[os_29._4_4_] = ctx_n_9._4_4_;
      }
      res_j_15._4_4_ = res_j_15._4_4_ + 1;
      local_620 = local_638;
      uVar2 = (uint32_t)k1.n;
      puVar10[-2] = 0x203f4a;
      puVar10[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar6,puVar4,uVar2,resM,puVar11,resM);
    }
  }
  return;
}

Assistant:

void
Hacl_GenericField32_exp_consttime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *aM,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *resM
)
{
  uint32_t len1 = Hacl_GenericField32_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint32_t), k1.len);
  uint32_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint32_t));
  memcpy(aMc, aM, k1.len * sizeof (uint32_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    uint32_t sw = 0U;
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 32U;
      uint32_t j = (bBits - i0 - 1U) % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      uint32_t sw1 = bit ^ sw;
      for (uint32_t i = 0U; i < len1; i++)
      {
        uint32_t dummy = (0U - sw1) & (resM[i] ^ aMc[i]);
        resM[i] = resM[i] ^ dummy;
        aMc[i] = aMc[i] ^ dummy;
      }
      uint32_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n0, k1.mu, aMc, resM, aMc);
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, resM, resM);
      sw = bit;
    }
    uint32_t sw0 = sw;
    for (uint32_t i = 0U; i < len1; i++)
    {
      uint32_t dummy = (0U - sw0) & (resM[i] ^ aMc[i]);
      resM[i] = resM[i] ^ dummy;
      aMc[i] = aMc[i] ^ dummy;
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 32U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), 16U * len1);
    uint32_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint32_t));
    uint32_t *t0 = table;
    uint32_t *t1 = table + len1;
    uint32_t *ctx_n0 = ctx;
    uint32_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint32_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint32_t *t11 = table + (i + 1U) * len1;
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint32_t));
      uint32_t *t2 = table + (2U * i + 2U) * len1;
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint32_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i0 = bBits / 4U * 4U;
      uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i0, 4U);
      memcpy(resM, (uint32_t *)(table + 0U * len1), len1 * sizeof (uint32_t));
      KRML_MAYBE_FOR15(i1,
        0U,
        15U,
        1U,
        uint32_t c = FStar_UInt32_eq_mask(bits_c, i1 + 1U);
        const uint32_t *res_j = table + (i1 + 1U) * len1;
        for (uint32_t i = 0U; i < len1; i++)
        {
          uint32_t *os = resM;
          uint32_t x = (c & res_j[i]) | (~c & resM[i]);
          os[i] = x;
        });
    }
    else
    {
      uint32_t *ctx_n = ctx;
      uint32_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint32_t));
    for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
    {
      KRML_MAYBE_FOR4(i,
        0U,
        4U,
        1U,
        uint32_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i0 - 4U;
      uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k2, 4U);
      memcpy(tmp0, (uint32_t *)(table + 0U * len1), len1 * sizeof (uint32_t));
      KRML_MAYBE_FOR15(i1,
        0U,
        15U,
        1U,
        uint32_t c = FStar_UInt32_eq_mask(bits_l, i1 + 1U);
        const uint32_t *res_j = table + (i1 + 1U) * len1;
        for (uint32_t i = 0U; i < len1; i++)
        {
          uint32_t *os = tmp0;
          uint32_t x = (c & res_j[i]) | (~c & tmp0[i]);
          os[i] = x;
        });
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}